

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QNetworkProxy *proxy)

{
  ProxyType PVar1;
  Int IVar2;
  QDebug *pQVar3;
  QDebug *this;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  ProxyType type;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_2;
  char16_t *str_3;
  char16_t *str_6;
  char16_t *str_5;
  char16_t *str_4;
  QStringList scaps;
  Capabilities caps;
  QDebugStateSaver saver;
  undefined4 in_stack_fffffffffffffcf8;
  undefined2 in_stack_fffffffffffffcfc;
  undefined1 in_stack_fffffffffffffcfe;
  char in_stack_fffffffffffffcff;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffd00;
  QString *in_stack_fffffffffffffd08;
  QListSpecialMethods<QString> *this_00;
  QDebug *in_stack_fffffffffffffd10;
  QDebug *in_stack_fffffffffffffd18;
  QChar sep;
  undefined4 in_stack_fffffffffffffd48;
  QChar local_1ea;
  QListSpecialMethods<QString> local_1e8 [24];
  QArrayDataPointer<char16_t> local_1d0 [2];
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_19c;
  QArrayDataPointer<char16_t> local_198 [2];
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_164;
  QArrayDataPointer<char16_t> local_160 [2];
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_12c;
  QArrayDataPointer<char16_t> local_128 [2];
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_f4;
  QArrayDataPointer<char16_t> local_f0 [2];
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_bc;
  QArrayDataPointer<char16_t> local_b8 [2];
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_84;
  QArrayDataPointer<char16_t> local_80 [2];
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_4c;
  QDebug local_48;
  undefined8 local_40;
  undefined8 local_38;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_2c;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  pQVar3 = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(pQVar3);
  PVar1 = QNetworkProxy::type((QNetworkProxy *)in_stack_fffffffffffffd00);
  switch(PVar1) {
  case DefaultProxy:
    QDebug::operator<<(in_stack_fffffffffffffd18,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
    break;
  case Socks5Proxy:
    QDebug::operator<<(in_stack_fffffffffffffd18,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
    break;
  case NoProxy:
    QDebug::operator<<(in_stack_fffffffffffffd18,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
    break;
  case HttpProxy:
    QDebug::operator<<(in_stack_fffffffffffffd18,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
    break;
  case HttpCachingProxy:
    QDebug::operator<<(in_stack_fffffffffffffd18,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
    break;
  case FtpCachingProxy:
    QDebug::operator<<(in_stack_fffffffffffffd18,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
    break;
  default:
    QDebug::operator<<(in_stack_fffffffffffffd18,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd00,
                       CONCAT13(in_stack_fffffffffffffcff,
                                CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  }
  pQVar3 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcff);
  QNetworkProxy::hostName((QNetworkProxy *)in_stack_fffffffffffffd08);
  QDebug::operator<<(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  QDebug::operator<<((QDebug *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcff);
  QNetworkProxy::port((QNetworkProxy *)in_stack_fffffffffffffd00);
  QDebug::operator<<((QDebug *)in_stack_fffffffffffffd00,
                     CONCAT11(in_stack_fffffffffffffcff,in_stack_fffffffffffffcfe));
  QDebug::operator<<(pQVar3,(char *)CONCAT44(PVar1,in_stack_fffffffffffffd48));
  sep.ucs = (char16_t)((ulong)pQVar3 >> 0x30);
  QString::~QString((QString *)0x24bfb1);
  local_2c.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)0xaaaaaaaa;
  local_2c.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QNetworkProxy::capabilities((QNetworkProxy *)in_stack_fffffffffffffd00);
  local_48.stream = (Stream *)0xaaaaaaaaaaaaaaaa;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x24c009);
  local_4c.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_stack_fffffffffffffd00,
                  CONCAT13(in_stack_fffffffffffffcff,
                           CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4c);
  if (IVar2 != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_80,(Data *)0x0,L"Tunnel",6);
    QString::QString((QString *)in_stack_fffffffffffffd00,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )));
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffd00,
               (rvalue_ref)
               CONCAT17(in_stack_fffffffffffffcff,
                        CONCAT16(in_stack_fffffffffffffcfe,
                                 CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))));
    QString::~QString((QString *)0x24c0bc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd00);
  }
  local_84.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_stack_fffffffffffffd00,
                  CONCAT13(in_stack_fffffffffffffcff,
                           CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
  if (IVar2 != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_b8,(Data *)0x0,L"Listen",6);
    QString::QString((QString *)in_stack_fffffffffffffd00,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )));
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffd00,
               (rvalue_ref)
               CONCAT17(in_stack_fffffffffffffcff,
                        CONCAT16(in_stack_fffffffffffffcfe,
                                 CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))));
    QString::~QString((QString *)0x24c170);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd00);
  }
  local_bc.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_stack_fffffffffffffd00,
                  CONCAT13(in_stack_fffffffffffffcff,
                           CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bc);
  if (IVar2 != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_f0,(Data *)0x0,L"UDP",3);
    QString::QString((QString *)in_stack_fffffffffffffd00,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )));
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffd00,
               (rvalue_ref)
               CONCAT17(in_stack_fffffffffffffcff,
                        CONCAT16(in_stack_fffffffffffffcfe,
                                 CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))));
    QString::~QString((QString *)0x24c230);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd00);
  }
  local_f4.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_stack_fffffffffffffd00,
                  CONCAT13(in_stack_fffffffffffffcff,
                           CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_f4);
  if (IVar2 != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_128,(Data *)0x0,L"Caching",7);
    QString::QString((QString *)in_stack_fffffffffffffd00,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )));
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffd00,
               (rvalue_ref)
               CONCAT17(in_stack_fffffffffffffcff,
                        CONCAT16(in_stack_fffffffffffffcfe,
                                 CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))));
    QString::~QString((QString *)0x24c2f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd00);
  }
  local_12c.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_stack_fffffffffffffd00,
                  CONCAT13(in_stack_fffffffffffffcff,
                           CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_12c);
  if (IVar2 != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_160,(Data *)0x0,L"NameLookup",10);
    QString::QString((QString *)in_stack_fffffffffffffd00,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )));
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffd00,
               (rvalue_ref)
               CONCAT17(in_stack_fffffffffffffcff,
                        CONCAT16(in_stack_fffffffffffffcfe,
                                 CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))));
    QString::~QString((QString *)0x24c3b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd00);
  }
  local_164.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_stack_fffffffffffffd00,
                  CONCAT13(in_stack_fffffffffffffcff,
                           CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_164);
  if (IVar2 != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_198,(Data *)0x0,L"SctpTunnel",10);
    QString::QString((QString *)in_stack_fffffffffffffd00,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )));
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffd00,
               (rvalue_ref)
               CONCAT17(in_stack_fffffffffffffcff,
                        CONCAT16(in_stack_fffffffffffffcfe,
                                 CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))));
    QString::~QString((QString *)0x24c470);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd00);
  }
  local_19c.super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (QFlagsStorage<QNetworkProxy::Capability>)
       QFlags<QNetworkProxy::Capability>::operator&
                 ((QFlags<QNetworkProxy::Capability> *)in_stack_fffffffffffffd00,
                  CONCAT13(in_stack_fffffffffffffcff,
                           CONCAT12(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcfc)));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_19c);
  if (IVar2 != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_1d0,(Data *)0x0,L"SctpListen",10);
    QString::QString((QString *)in_stack_fffffffffffffd00,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcff,
                              CONCAT16(in_stack_fffffffffffffcfe,
                                       CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      )));
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffd00,
               (rvalue_ref)
               CONCAT17(in_stack_fffffffffffffcff,
                        CONCAT16(in_stack_fffffffffffffcfe,
                                 CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))));
    QString::~QString((QString *)0x24c530);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd00);
  }
  this = QDebug::operator<<((QDebug *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcff);
  QChar::QChar<char16_t,_true>(&local_1ea,L' ');
  this_00 = local_1e8;
  pQVar3 = &local_48;
  QListSpecialMethods<QString>::join(this_00,sep);
  QDebug::operator<<(pQVar3,(QString *)this_00);
  QDebug::operator<<(this,in_stack_fffffffffffffcff);
  QString::~QString((QString *)0x24c5b0);
  QDebug::QDebug(this,(QDebug *)
                      CONCAT17(in_stack_fffffffffffffcff,
                               CONCAT16(in_stack_fffffffffffffcfe,
                                        CONCAT24(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ))));
  QList<QString>::~QList((QList<QString> *)0x24c5c9);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, const QNetworkProxy &proxy)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    QNetworkProxy::ProxyType type = proxy.type();
    switch (type) {
    case QNetworkProxy::NoProxy:
        debug << "NoProxy ";
        break;
    case QNetworkProxy::DefaultProxy:
        debug << "DefaultProxy ";
        break;
    case QNetworkProxy::Socks5Proxy:
        debug << "Socks5Proxy ";
        break;
    case QNetworkProxy::HttpProxy:
        debug << "HttpProxy ";
        break;
    case QNetworkProxy::HttpCachingProxy:
        debug << "HttpCachingProxy ";
        break;
    case QNetworkProxy::FtpCachingProxy:
        debug << "FtpCachingProxy ";
        break;
    default:
        debug << "Unknown proxy " << int(type);
        break;
    }
    debug << '"' << proxy.hostName() << ':' << proxy.port() << "\" ";
    QNetworkProxy::Capabilities caps = proxy.capabilities();
    QStringList scaps;
    if (caps & QNetworkProxy::TunnelingCapability)
        scaps << QStringLiteral("Tunnel");
    if (caps & QNetworkProxy::ListeningCapability)
        scaps << QStringLiteral("Listen");
    if (caps & QNetworkProxy::UdpTunnelingCapability)
        scaps << QStringLiteral("UDP");
    if (caps & QNetworkProxy::CachingCapability)
        scaps << QStringLiteral("Caching");
    if (caps & QNetworkProxy::HostNameLookupCapability)
        scaps << QStringLiteral("NameLookup");
    if (caps & QNetworkProxy::SctpTunnelingCapability)
        scaps << QStringLiteral("SctpTunnel");
    if (caps & QNetworkProxy::SctpListeningCapability)
        scaps << QStringLiteral("SctpListen");
    debug << '[' << scaps.join(u' ') << ']';
    return debug;
}